

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dill_util.c
# Opt level: O2

void dill_pcompare(dill_stream_conflict s,int op_type,int data_type,dill_reg dest,dill_reg src1,
                  dill_reg src2)

{
  jmp_data *pjVar1;
  int iVar2;
  
  if (5 < (uint)op_type) {
    puts("Bad op type in dill_pcompare");
  }
  iVar2 = op_type * 0xb + data_type;
  pjVar1 = s->j->c_data;
  (*s->j->jmp_c[iVar2])(s,(int)pjVar1[iVar2].data1,(int)pjVar1[iVar2].data2,dest,src1,src2);
  return;
}

Assistant:

extern void
dill_pcompare(dill_stream s,
              int op_type,
              int data_type,
              dill_reg dest,
              dill_reg src1,
              dill_reg src2)
{
    int index;
    if ((op_type < dill_eq_code) || (op_type > dill_ne_code)) {
        printf("Bad op type in dill_pcompare\n");
    }
    index = data_type + 11 * op_type;
    (s->j->jmp_c)[index](s, s->j->c_data[index].data1,
                         s->j->c_data[index].data2, dest, src1, src2);
}